

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

void jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color)

{
  opj_image_comp_t *poVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  opj_jp2_pclr_t *poVar5;
  uchar *puVar6;
  uint *puVar7;
  uchar *puVar8;
  opj_jp2_cmap_comp_t *poVar9;
  opj_image_comp_t *__ptr;
  OPJ_INT32 *pOVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  opj_image_comp_t *poVar13;
  OPJ_UINT32 OVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  opj_image_comp_t *poVar21;
  OPJ_INT32 *pOVar22;
  ushort uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  OPJ_UINT32 OVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  
  poVar5 = color->jp2_pclr;
  puVar6 = poVar5->channel_size;
  puVar7 = poVar5->entries;
  puVar8 = poVar5->channel_sign;
  poVar9 = poVar5->cmap;
  uVar23 = poVar5->nr_channels;
  uVar28 = (ulong)uVar23;
  OVar27 = (OPJ_UINT32)uVar23;
  __ptr = image->comps;
  poVar21 = (opj_image_comp_t *)malloc(uVar28 * 0x38);
  if (uVar28 == 0) {
    OVar27 = 0;
  }
  else {
    uVar30 = 0;
    do {
      bVar2 = poVar9[uVar30].pcol;
      uVar3 = poVar9[uVar30].cmp;
      poVar21[bVar2].data = __ptr[uVar3].data;
      poVar1 = __ptr + uVar3;
      OVar17 = poVar1->dx;
      OVar18 = poVar1->dy;
      OVar19 = poVar1->w;
      OVar20 = poVar1->h;
      poVar1 = __ptr + uVar3;
      OVar15 = poVar1->x0;
      OVar16 = poVar1->y0;
      uVar11 = *(undefined8 *)(&poVar1->x0 + 2);
      poVar1 = __ptr + uVar3;
      OVar14 = poVar1->resno_decoded;
      uVar12 = *(undefined8 *)(&poVar1->sgnd + 2);
      poVar13 = poVar21 + bVar2;
      poVar13->sgnd = poVar1->sgnd;
      poVar13->resno_decoded = OVar14;
      *(undefined8 *)(&poVar13->sgnd + 2) = uVar12;
      poVar1 = poVar21 + bVar2;
      poVar1->x0 = OVar15;
      poVar1->y0 = OVar16;
      *(undefined8 *)(&poVar1->x0 + 2) = uVar11;
      poVar1 = poVar21 + bVar2;
      poVar1->dx = OVar17;
      poVar1->dy = OVar18;
      poVar1->w = OVar19;
      poVar1->h = OVar20;
      if (poVar9[uVar30].mtyp == '\0') {
        __ptr[uVar3].data = (OPJ_INT32 *)0x0;
      }
      else {
        pOVar22 = (OPJ_INT32 *)malloc((ulong)(__ptr[uVar3].h * __ptr[uVar3].w) << 2);
        poVar21[bVar2].data = pOVar22;
        poVar21[bVar2].prec = (uint)puVar6[uVar30];
        poVar21[bVar2].sgnd = (uint)puVar8[uVar30];
      }
      uVar30 = uVar30 + 1;
    } while (uVar28 != uVar30);
    if (uVar28 == 0) {
      OVar27 = 0;
    }
    else {
      uVar3 = poVar5->nr_entries;
      uVar30 = 0;
      do {
        if (poVar9[uVar30].mtyp != '\0') {
          uVar24 = (ulong)poVar9[uVar30].pcol;
          uVar25 = poVar21[uVar24].h * poVar21[uVar24].w;
          if (uVar25 != 0) {
            pOVar22 = __ptr[poVar9[uVar30].cmp].data;
            pOVar10 = poVar21[uVar24].data;
            uVar26 = 0;
            do {
              iVar4 = pOVar22[uVar26];
              iVar29 = uVar3 - 1;
              if (iVar4 < (int)(uint)uVar3) {
                iVar29 = iVar4;
              }
              if (iVar4 < 0) {
                iVar29 = 0;
              }
              pOVar10[uVar26] = puVar7[(long)(int)(iVar29 * (uint)uVar23) + uVar24];
              uVar26 = uVar26 + 1;
            } while (uVar25 != uVar26);
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar28);
    }
  }
  uVar25 = image->numcomps;
  if (uVar25 != 0) {
    uVar23 = 0;
    do {
      if (__ptr[uVar23].data != (OPJ_INT32 *)0x0) {
        free(__ptr[uVar23].data);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 < uVar25);
  }
  free(__ptr);
  image->comps = poVar21;
  image->numcomps = OVar27;
  jp2_free_pclr(color);
  return;
}

Assistant:

static void jp2_apply_pclr(opj_image_t *image, opj_jp2_color_t *color)
{
	opj_image_comp_t *old_comps, *new_comps;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	opj_jp2_cmap_comp_t *cmap;
	OPJ_INT32 *src, *dst;
	OPJ_UINT32 j, max;
	OPJ_UINT16 i, nr_channels, cmp, pcol;
	OPJ_INT32 k, top_k;

	channel_size = color->jp2_pclr->channel_size;
	channel_sign = color->jp2_pclr->channel_sign;
	entries = color->jp2_pclr->entries;
	cmap = color->jp2_pclr->cmap;
	nr_channels = color->jp2_pclr->nr_channels;

	old_comps = image->comps;
	new_comps = (opj_image_comp_t*)
			opj_malloc(nr_channels * sizeof(opj_image_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		pcol = cmap[i].pcol; cmp = cmap[i].cmp;

		new_comps[pcol] = old_comps[cmp];

		/* Direct use */
		if(cmap[i].mtyp == 0){
			old_comps[cmp].data = NULL; continue;
		}

		/* Palette mapping: */
		new_comps[pcol].data = (int*)
				opj_malloc(old_comps[cmp].w * old_comps[cmp].h * sizeof(int));
		new_comps[pcol].prec = channel_size[i];
		new_comps[pcol].sgnd = channel_sign[i];
	}

	top_k = color->jp2_pclr->nr_entries - 1;

	for(i = 0; i < nr_channels; ++i) {
		/* Direct use: */
		if(cmap[i].mtyp == 0) continue;

		/* Palette mapping: */
		cmp = cmap[i].cmp; pcol = cmap[i].pcol;
		src = old_comps[cmp].data;
		dst = new_comps[pcol].data;
		max = new_comps[pcol].w * new_comps[pcol].h;

		for(j = 0; j < max; ++j)
		{
			/* The index */
			if((k = src[j]) < 0) k = 0; else if(k > top_k) k = top_k;

			/* The colour */
			dst[j] = entries[k * nr_channels + pcol];
		}
	}

	max = image->numcomps;
	for(i = 0; i < max; ++i) {
		if(old_comps[i].data) opj_free(old_comps[i].data);
	}

	opj_free(old_comps);
	image->comps = new_comps;
	image->numcomps = nr_channels;

	jp2_free_pclr(color);

}